

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

size_t __thiscall google::protobuf::Reflection::SpaceUsedLong(Reflection *this,Message *message)

{
  bool bVar1;
  uint32 uVar2;
  CppType CVar3;
  int iVar4;
  FieldDescriptor *this_00;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<unsigned_long> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<float> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedField<int> *pRVar5;
  OneofDescriptor *pOVar6;
  ArenaStringPtr *pAVar7;
  size_t sVar8;
  Message **ppMVar9;
  undefined4 extraout_var;
  Message *in_RSI;
  string *in_RDI;
  Message *sub_message;
  string *ptr;
  string *default_ptr;
  string *ptr_1;
  FieldDescriptor *field;
  int i;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Reflection *in_stack_ffffffffffffffa0;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffb0;
  Reflection *in_stack_ffffffffffffffb8;
  Reflection *in_stack_ffffffffffffffc0;
  UnknownFieldSet *in_stack_ffffffffffffffc8;
  int local_24;
  size_t local_20;
  
  uVar2 = internal::ReflectionSchema::GetObjectSize((ReflectionSchema *)&in_RDI->_M_string_length);
  GetUnknownFields(in_stack_ffffffffffffffa0,
                   (Message *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_20 = UnknownFieldSet::SpaceUsedExcludingSelfLong(in_stack_ffffffffffffffc8);
  local_20 = local_20 + uVar2;
  bVar1 = internal::ReflectionSchema::HasExtensionSet((ReflectionSchema *)&in_RDI->_M_string_length)
  ;
  if (bVar1) {
    GetExtensionSet(in_stack_ffffffffffffffa0,
                    (Message *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    sVar8 = internal::ExtensionSet::SpaceUsedExcludingSelfLong
                      ((ExtensionSet *)in_stack_ffffffffffffffb0);
    local_20 = sVar8 + local_20;
  }
  for (local_24 = 0; local_24 <= (int)in_RDI[2]._M_string_length; local_24 = local_24 + 1) {
    this_00 = Descriptor::field(*(Descriptor **)in_RDI,local_24);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x6cdeb8);
    if (bVar1) {
      CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6cdecb);
      in_stack_ffffffffffffffa0 = (Reflection *)(ulong)(CVar3 - CPPTYPE_INT32);
      switch(in_stack_ffffffffffffffa0) {
      case (Reflection *)0x0:
        pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>
                           (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                            (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<int>::SpaceUsedExcludingSelfLong(pRVar5);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x1:
        this_01 = GetRaw<google::protobuf::RepeatedField<long>>
                            (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                             (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<long>::SpaceUsedExcludingSelfLong(this_01);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x2:
        this_02 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>
                            (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                             (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<unsigned_int>::SpaceUsedExcludingSelfLong(this_02);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x3:
        this_03 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>
                            (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                             (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<unsigned_long>::SpaceUsedExcludingSelfLong(this_03);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x4:
        this_04 = GetRaw<google::protobuf::RepeatedField<double>>
                            (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                             (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<double>::SpaceUsedExcludingSelfLong(this_04);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x5:
        this_05 = GetRaw<google::protobuf::RepeatedField<float>>
                            (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                             (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<float>::SpaceUsedExcludingSelfLong(this_05);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x6:
        this_06 = GetRaw<google::protobuf::RepeatedField<bool>>
                            (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                             (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<bool>::SpaceUsedExcludingSelfLong(this_06);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x7:
        pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>
                           (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                            (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedField<int>::SpaceUsedExcludingSelfLong(pRVar5);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x8:
        FieldDescriptor::options(this_00);
        FieldOptions::ctype((FieldOptions *)0x6ce05c);
        GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                  (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                   (FieldDescriptor *)in_RDI);
        sVar8 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::SpaceUsedExcludingSelfLong
                          ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x6ce080);
        local_20 = sVar8 + local_20;
        break;
      case (Reflection *)0x9:
        bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x6ce096);
        if (bVar1) {
          GetRaw<google::protobuf::internal::MapFieldBase>
                    (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                     (FieldDescriptor *)in_RDI);
          sVar8 = internal::MapFieldBase::SpaceUsedExcludingSelfLong
                            ((MapFieldBase *)in_stack_ffffffffffffffa0);
        }
        else {
          GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                    (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                     (FieldDescriptor *)in_RDI);
          sVar8 = internal::RepeatedPtrFieldBase::
                  SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                            (in_stack_ffffffffffffffb0);
        }
        local_20 = sVar8 + local_20;
      }
    }
    else {
      pOVar6 = FieldDescriptor::containing_oneof(this_00);
      if (((pOVar6 == (OneofDescriptor *)0x0) ||
          (bVar1 = HasOneofField(in_stack_ffffffffffffffc0,(Message *)in_stack_ffffffffffffffb8,
                                 (FieldDescriptor *)in_stack_ffffffffffffffb0), bVar1)) &&
         (CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6ce128), 7 < CVar3 - CPPTYPE_INT32)
         ) {
        if (CVar3 == CPPTYPE_STRING) {
          FieldDescriptor::options(this_00);
          FieldOptions::ctype((FieldOptions *)0x6ce16d);
          bVar1 = IsInlined(in_stack_ffffffffffffffa0,
                            (FieldDescriptor *)CONCAT44(CVar3,in_stack_ffffffffffffff98));
          if (bVar1) {
            GetField<google::protobuf::internal::InlinedStringField>
                      (in_stack_ffffffffffffffa0,
                       (Message *)CONCAT44(CVar3,in_stack_ffffffffffffff98),
                       (FieldDescriptor *)0x6ce19e);
            sVar8 = internal::StringSpaceUsedExcludingSelfLong(in_RDI);
            local_20 = sVar8 + local_20;
          }
          else {
            pAVar7 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>
                               (in_stack_ffffffffffffffa0,
                                (FieldDescriptor *)CONCAT44(CVar3,in_stack_ffffffffffffff98));
            in_stack_ffffffffffffffc0 =
                 (Reflection *)internal::ArenaStringPtr::Get_abi_cxx11_(pAVar7);
            pAVar7 = GetField<google::protobuf::internal::ArenaStringPtr>
                               (in_stack_ffffffffffffffa0,
                                (Message *)CONCAT44(CVar3,in_stack_ffffffffffffff98),
                                (FieldDescriptor *)0x6ce1f3);
            in_stack_ffffffffffffffb8 =
                 (Reflection *)internal::ArenaStringPtr::Get_abi_cxx11_(pAVar7);
            if (in_stack_ffffffffffffffb8 != in_stack_ffffffffffffffc0) {
              sVar8 = internal::StringSpaceUsedExcludingSelfLong(in_RDI);
              local_20 = sVar8 + 0x20 + local_20;
            }
          }
        }
        else if ((CVar3 == CPPTYPE_MESSAGE) &&
                (bVar1 = internal::ReflectionSchema::IsDefaultInstance
                                   ((ReflectionSchema *)&in_RDI->_M_string_length,in_RSI), !bVar1))
        {
          ppMVar9 = GetRaw<google::protobuf::Message_const*>
                              (in_stack_ffffffffffffffb8,(Message *)in_stack_ffffffffffffffb0,
                               (FieldDescriptor *)in_RDI);
          in_stack_ffffffffffffffb0 = (RepeatedPtrFieldBase *)*ppMVar9;
          if (in_stack_ffffffffffffffb0 != (RepeatedPtrFieldBase *)0x0) {
            iVar4 = (*((MessageLite *)&in_stack_ffffffffffffffb0->arena_)->_vptr_MessageLite[0x13])
                              ();
            local_20 = CONCAT44(extraout_var,iVar4) + local_20;
          }
        }
      }
    }
  }
  return local_20;
}

Assistant:

size_t Reflection::SpaceUsedLong(const Message& message) const {
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field) \
                      .SpaceUsedExcludingSelfLong();                \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              total_size +=
                  GetRaw<RepeatedPtrField<std::string> >(message, field)
                      .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<internal::MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (field->containing_oneof() && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_BOOL:
        case FieldDescriptor::CPPTYPE_ENUM:
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* ptr =
                    &GetField<InlinedStringField>(message, field).GetNoArena();
                total_size += StringSpaceUsedExcludingSelfLong(*ptr);
                break;
              }

              // Initially, the string points to the default value stored
              // in the prototype. Only count the string if it has been
              // changed from the default value.
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              const std::string* ptr =
                  &GetField<ArenaStringPtr>(message, field).Get();

              if (ptr != default_ptr) {
                // string fields are represented by just a pointer, so also
                // include sizeof(string) as well.
                total_size +=
                    sizeof(*ptr) + StringSpaceUsedExcludingSelfLong(*ptr);
              }
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != nullptr) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  return total_size;
}